

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O1

Function<std::tuple<int,_int>_(),_false> * __thiscall
crampl::detail::Function<std::tuple<int,int>(),false>::operator=
          (Function<std::tuple<int,int>(),false> *this,
          Function<std::tuple<int,_int>_(),_false> *_rhs)

{
  (**(code **)(this + 0x10))(this,0);
  *(_func_void_selfType_ptr_selfType_ptr_conflict **)(this + 0x10) = _rhs->manager;
  _rhs->manager = Function<std::tuple<int,_int>_(),_false>::noop_manager;
  *(_func_tuple<int,_int>_VoidPtrWithConstness **)(this + 8) = _rhs->invoke;
  _rhs->invoke = Function<std::tuple<int,_int>_(),_false>::bad_invoke;
  (**(code **)(this + 0x10))(_rhs,this);
  return (Function<std::tuple<int,_int>_(),_false> *)this;
}

Assistant:

Function& operator=(T&& _rhs) noexcept {
		destroy();
		init_from(std::forward<T>(_rhs));
		return *this;
	}